

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O3

GCtab * newtab(lua_State *L,uint32_t asize,uint32_t hbits)

{
  GCtab *pGVar1;
  void *pvVar2;
  int iVar3;
  
  if (asize - 1 < 0x10) {
    pGVar1 = (GCtab *)lj_mem_newgco(L,asize * 8 + 0x20);
    pGVar1->gct = '\v';
    pGVar1->nomm = 0xff;
    pGVar1->colo = (int8_t)asize;
    (pGVar1->array).ptr32 = (int)pGVar1 + 0x20;
    (pGVar1->metatable).gcptr32 = 0;
    pGVar1->asize = asize;
    pGVar1->hmask = 0;
    (pGVar1->node).ptr32 = (L->glref).ptr32 + 0x68;
  }
  else {
    pGVar1 = (GCtab *)lj_mem_newgco(L,0x20);
    pGVar1->gct = '\v';
    pGVar1->nomm = 0xff;
    pGVar1->colo = '\0';
    (pGVar1->array).ptr32 = 0;
    (pGVar1->metatable).gcptr32 = 0;
    pGVar1->asize = 0;
    pGVar1->hmask = 0;
    (pGVar1->node).ptr32 = (L->glref).ptr32 + 0x68;
    if (asize != 0) {
      if (0x8000001 < asize) goto LAB_00109d35;
      pvVar2 = lj_mem_realloc(L,(void *)0x0,0,asize * 8);
      (pGVar1->array).ptr32 = (uint32_t)pvVar2;
      pGVar1->asize = asize;
    }
  }
  if (hbits != 0) {
    if (0x1a < hbits) {
LAB_00109d35:
      lj_err_msg(L,LJ_ERR_TABOV);
    }
    iVar3 = 1 << ((byte)hbits & 0x1f);
    pvVar2 = lj_mem_realloc(L,(void *)0x0,0,(MSize)(0x18L << ((byte)hbits & 0x3f)));
    *(uint32_t *)((long)pvVar2 + 0x14) = (uint32_t)pvVar2 + iVar3 * 0x18;
    (pGVar1->node).ptr32 = (uint32_t)pvVar2;
    pGVar1->hmask = iVar3 - 1;
  }
  return pGVar1;
}

Assistant:

static GCtab *newtab(lua_State *L, uint32_t asize, uint32_t hbits)
{
  GCtab *t;
  /* First try to colocate the array part. */
  if (LJ_MAX_COLOSIZE != 0 && asize > 0 && asize <= LJ_MAX_COLOSIZE) {
    lua_assert((sizeof(GCtab) & 7) == 0);
    t = (GCtab *)lj_mem_newgco(L, sizetabcolo(asize));
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = (int8_t)asize;
    setmref(t->array, (TValue *)((char *)t + sizeof(GCtab)));
    setgcrefnull(t->metatable);
    t->asize = asize;
    t->hmask = 0;
    setmref(t->node, &G(L)->nilnode);
  } else {  /* Otherwise separately allocate the array part. */
    t = lj_mem_newobj(L, GCtab);
    t->gct = ~LJ_TTAB;
    t->nomm = (uint8_t)~0;
    t->colo = 0;
    setmref(t->array, NULL);
    setgcrefnull(t->metatable);
    t->asize = 0;  /* In case the array allocation fails. */
    t->hmask = 0;
    setmref(t->node, &G(L)->nilnode);
    if (asize > 0) {
      if (asize > LJ_MAX_ASIZE)
	lj_err_msg(L, LJ_ERR_TABOV);
      setmref(t->array, lj_mem_newvec(L, asize, TValue));
      t->asize = asize;
    }
  }
  if (hbits)
    newhpart(L, t, hbits);
  return t;
}